

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O2

void __thiscall
SmallDenseSet<TypePair,_TypePairHasher,_32U>::SmallDenseSet
          (SmallDenseSet<TypePair,_TypePairHasher,_32U> *this,Allocator *allocator)

{
  TypePair *__s;
  
  __s = this->storage;
  memset(__s,0,0x200);
  this->allocator = allocator;
  this->bucketCount = 0x20;
  this->count = 0;
  this->data = __s;
  NULLC::fillMemory(__s,0,0x200);
  return;
}

Assistant:

SmallDenseSet(Allocator *allocator = 0): allocator(allocator)
	{
		assert(N >= 2 && "size is too small");
		assert((N & (N - 1)) == 0 && "only power of 2 sizes are supported");

		bucketCount = N;

		count = 0;

		data = storage;

		NULLC::fillMemory(data, 0, sizeof(Key) * bucketCount);
	}